

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O1

char * ucnv_io_getConverterName_63(char *alias,UBool *containsOption,UErrorCode *pErrorCode)

{
  uint16_t uVar1;
  uint16_t *puVar2;
  uint16_t *puVar3;
  UConverterAliasOptions *pUVar4;
  uint16_t *puVar5;
  uint16_t *puVar6;
  UBool UVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  size_t sVar11;
  char *dst;
  int iVar12;
  uint32_t uVar13;
  uint uVar14;
  bool bVar15;
  char strippedName [60];
  char local_78 [72];
  
  iVar12 = 0;
  do {
    if (iVar12 != 0) {
      if (*alias != 'x') {
        return (char *)0x0;
      }
      if (alias[1] != '-') {
        return (char *)0x0;
      }
      alias = alias + 2;
    }
    UVar7 = haveAliasData(pErrorCode);
    pUVar4 = gMainTable.optionTable;
    if (UVar7 == '\0') {
      return (char *)0x0;
    }
    if (alias == (char *)0x0) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
      return (char *)0x0;
    }
    if (*alias == '\0') {
      return (char *)0x0;
    }
    uVar1 = (gMainTable.optionTable)->stringNormalizationType;
    dst = alias;
    if (uVar1 == 0) {
LAB_002c40da:
      puVar6 = gMainTable.normalizedStringTable;
      puVar5 = gMainTable.stringTable;
      puVar2 = gMainTable.aliasList;
      uVar14 = 0;
      uVar13 = gMainTable.untaggedConvArraySize;
      uVar10 = gMainTable.untaggedConvArraySize >> 1;
      do {
        if (uVar1 == 0) {
          iVar8 = ucnv_compareNames_63(dst,(char *)(puVar5 + puVar2[uVar10]));
        }
        else {
          iVar8 = strcmp(dst,(char *)(puVar6 + puVar2[uVar10]));
        }
        puVar3 = gMainTable.untaggedConvArray;
        uVar9 = uVar10;
        if ((-1 < iVar8) && (uVar9 = uVar13, uVar14 = uVar10, iVar8 == 0)) {
          uVar1 = gMainTable.untaggedConvArray[uVar10];
          if ((short)uVar1 < 0) {
            *pErrorCode = U_AMBIGUOUS_ALIAS_WARNING;
          }
          if (containsOption != (UBool *)0x0) {
            *containsOption = (byte)(uVar1 >> 0xe) & 1 | (char)pUVar4->containsCnvOptionInfo == '\0'
            ;
          }
          uVar10 = puVar3[uVar10] & 0xfff;
          goto LAB_002c41cf;
        }
        uVar13 = uVar9;
        uVar9 = uVar13 + uVar14 >> 1;
        bVar15 = uVar10 != uVar9;
        uVar10 = uVar9;
      } while (bVar15);
      uVar10 = 0xffffffff;
    }
    else {
      sVar11 = strlen(alias);
      if (sVar11 < 0x3c) {
        dst = local_78;
        ucnv_io_stripASCIIForCompare_63(dst,alias);
        goto LAB_002c40da;
      }
      *pErrorCode = U_BUFFER_OVERFLOW_ERROR;
      uVar10 = 0xffffffff;
    }
LAB_002c41cf:
    if (uVar10 < gMainTable.converterListSize) {
      return (char *)((ulong)((uint)gMainTable.converterList[uVar10] * 2) +
                     (long)gMainTable.stringTable);
    }
    bVar15 = iVar12 != 0;
    iVar12 = iVar12 + 1;
    if (bVar15) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

U_CAPI const char *
ucnv_io_getConverterName(const char *alias, UBool *containsOption, UErrorCode *pErrorCode) {
    const char *aliasTmp = alias;
    int32_t i = 0;
    for (i = 0; i < 2; i++) {
        if (i == 1) {
            /*
             * After the first unsuccess converter lookup, check to see if
             * the name begins with 'x-'. If it does, strip it off and try
             * again.  This behaviour is similar to how ICU4J does it.
             */
            if (aliasTmp[0] == 'x' && aliasTmp[1] == '-') {
                aliasTmp = aliasTmp+2;
            } else {
                break;
            }
        }
        if(haveAliasData(pErrorCode) && isAlias(aliasTmp, pErrorCode)) {
            uint32_t convNum = findConverter(aliasTmp, containsOption, pErrorCode);
            if (convNum < gMainTable.converterListSize) {
                return GET_STRING(gMainTable.converterList[convNum]);
            }
            /* else converter not found */
        } else {
            break;
        }
    }

    return NULL;
}